

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t add_owner_id(archive_match *a,id_array *ids,int64_t id)

{
  size_t sVar1;
  wchar_t wVar2;
  int64_t *piVar3;
  void *p;
  uint i;
  int64_t id_local;
  id_array *ids_local;
  archive_match *a_local;
  
  if (ids->size <= ids->count + 1) {
    if (ids->size == 0) {
      ids->size = 8;
    }
    else {
      ids->size = ids->size << 1;
    }
    piVar3 = (int64_t *)realloc(ids->ids,ids->size << 3);
    if (piVar3 == (int64_t *)0x0) {
      wVar2 = error_nomem(a);
      return wVar2;
    }
    ids->ids = piVar3;
  }
  for (p._4_4_ = 0; ((ulong)p._4_4_ < ids->count && (ids->ids[p._4_4_] < id)); p._4_4_ = p._4_4_ + 1
      ) {
  }
  if ((ulong)p._4_4_ == ids->count) {
    sVar1 = ids->count;
    ids->count = sVar1 + 1;
    ids->ids[sVar1] = id;
  }
  else if (ids->ids[p._4_4_] != id) {
    memmove(ids->ids + (p._4_4_ + 1),ids->ids + p._4_4_,(ids->count - (ulong)p._4_4_) * 8);
    ids->ids[p._4_4_] = id;
    ids->count = ids->count + 1;
  }
  a->setflag = a->setflag | 4;
  return L'\0';
}

Assistant:

static int
add_owner_id(struct archive_match *a, struct id_array *ids, int64_t id)
{
	unsigned i;

	if (ids->count + 1 >= ids->size) {
		void *p;

		if (ids->size == 0)
			ids->size = 8;
		else
			ids->size *= 2;
		p = realloc(ids->ids, sizeof(*ids->ids) * ids->size);
		if (p == NULL)
			return (error_nomem(a));
		ids->ids = (int64_t *)p;
	}

	/* Find an insert point. */
	for (i = 0; i < ids->count; i++) {
		if (ids->ids[i] >= id)
			break;
	}

	/* Add owner id. */
	if (i == ids->count)
		ids->ids[ids->count++] = id;
	else if (ids->ids[i] != id) {
		memmove(&(ids->ids[i+1]), &(ids->ids[i]),
		    (ids->count - i) * sizeof(ids->ids[0]));
		ids->ids[i] = id;
		ids->count++;
	}
	a->setflag |= ID_IS_SET;
	return (ARCHIVE_OK);
}